

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void sysbvm_gc_markPointer(void *userdata,sysbvm_tuple_t *pointerAddress)

{
  _Bool _Var1;
  uint32_t uVar2;
  sysbvm_tuple_t sStack_28;
  _Bool isWhite;
  sysbvm_tuple_t pointer;
  sysbvm_context_t *context;
  sysbvm_tuple_t *pointerAddress_local;
  void *userdata_local;
  
  sStack_28 = *pointerAddress;
  pointer = (sysbvm_tuple_t)userdata;
  context = (sysbvm_context_t *)pointerAddress;
  pointerAddress_local = (sysbvm_tuple_t *)userdata;
  _Var1 = sysbvm_tuple_isNonNullPointer(sStack_28);
  if ((_Var1) &&
     (uVar2 = sysbvm_tuple_getGCColor(sStack_28), uVar2 == *(uint32_t *)(pointer + 0x30))) {
    sysbvm_tuple_setGCColor(sStack_28,*(uint32_t *)(pointer + 0x34));
    sysbvm_dynarray_add((sysbvm_dynarray_t *)(pointer + 0x22a8),&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

static void sysbvm_gc_markPointer(void *userdata, sysbvm_tuple_t *pointerAddress)
{
    sysbvm_context_t *context = (sysbvm_context_t*)userdata;

    sysbvm_tuple_t pointer = *pointerAddress;
    if(!sysbvm_tuple_isNonNullPointer(pointer))
        return;

    bool isWhite = sysbvm_tuple_getGCColor(pointer) == context->heap.gcWhiteColor;
    if(!isWhite)
        return;

    sysbvm_tuple_setGCColor(pointer, context->heap.gcGrayColor);
    sysbvm_dynarray_add(&context->markingStack, &pointer);
}